

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

bool __thiscall wabt::WastParser::ParseBindVarOpt(WastParser *this,string *name)

{
  TokenType TVar1;
  Token token;
  string_view local_90;
  string local_80;
  Token local_60;
  
  TVar1 = Peek(this,0);
  if (TVar1 == Last_String) {
    Consume(&local_60,this);
    if (5 < local_60.token_type_ - AlignEqNat) {
      __assert_fail("HasText()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/token.h"
                    ,0x5b,"string_view wabt::Token::text() const");
    }
    local_90.data_ = local_60.field_2.text_.data_;
    local_90.size_ = local_60.field_2.text_.size_;
    string_view::to_string_abi_cxx11_(&local_80,&local_90);
    std::__cxx11::string::operator=((string *)name,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  return TVar1 == Last_String;
}

Assistant:

bool WastParser::ParseBindVarOpt(std::string* name) {
  WABT_TRACE(ParseBindVarOpt);
  if (!PeekMatch(TokenType::Var)) {
    return false;
  }
  Token token = Consume();
  *name = token.text().to_string();
  return true;
}